

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_join(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,
                           int toLocaleString)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint32_t uVar3;
  int iVar4;
  uint32_t idx;
  uint32_t c;
  JSValue JVar5;
  JSValue JVar6;
  JSValue JVar7;
  int64_t local_70;
  JSValueUnion local_68;
  StringBuffer local_50;
  
  uVar3 = js_typed_array_get_length_internal(ctx,this_val);
  if ((int)uVar3 < 0) {
    JVar6 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    c = 0x2c;
    idx = 0;
    if (argc < 1 || toLocaleString != 0) {
      JVar6 = (JSValue)(ZEXT816(6) << 0x40);
      JVar5 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      uVar1 = argv->tag;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      JVar6 = (JSValue)(auVar2 << 0x40);
      JVar5 = (JSValue)(ZEXT816(3) << 0x40);
      if ((int)uVar1 != 3) {
        JVar6.tag = uVar1;
        JVar6.u.ptr = (argv->u).ptr;
        JVar6 = JS_ToString(ctx,JVar6);
        if ((int)JVar6.tag == 6) {
LAB_0015c8d6:
          return (JSValue)(ZEXT816(6) << 0x40);
        }
        JVar5 = JVar6;
        if (*(int *)((long)JVar6.u.ptr + 4) == 1) {
          c = (uint32_t)*(byte *)((long)JVar6.u.ptr + 0x10);
        }
        else {
          c = 0xffffffff;
        }
      }
    }
    string_buffer_init(ctx,&local_50,0);
    while( true ) {
      local_70 = JVar5.tag;
      local_68 = JVar5.u;
      if (uVar3 == idx) break;
      if (idx != 0) {
        if ((int)c < 0) {
          iVar4 = string_buffer_concat
                            (&local_50,(JSString *)local_68.ptr,0,
                             *(uint *)((long)local_68.ptr + 4) & 0x7fffffff);
        }
        else {
          iVar4 = string_buffer_putc8(&local_50,c);
        }
        if (iVar4 == 0) goto LAB_0015c868;
LAB_0015c8af:
        (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
        JVar7.tag = local_70;
        JVar7.u.ptr = JVar6.u.ptr;
        JS_FreeValue(ctx,JVar7);
        goto LAB_0015c8d6;
      }
LAB_0015c868:
      JVar7 = JS_GetPropertyUint32(ctx,this_val,idx);
      if (1 < (int)JVar7.tag - 2U) {
        if ((int)JVar7.tag != 6) {
          if (toLocaleString != 0) {
            JVar7 = JS_ToLocaleStringFree(ctx,JVar7);
          }
          iVar4 = string_buffer_concat_value_free(&local_50,JVar7);
          if (iVar4 == 0) goto LAB_0015c8a8;
        }
        goto LAB_0015c8af;
      }
LAB_0015c8a8:
      idx = idx + 1;
    }
    JVar5.tag = local_70;
    JVar5.u.ptr = JVar6.u.ptr;
    JS_FreeValue(ctx,JVar5);
    JVar6 = string_buffer_end(&local_50);
  }
  return JVar6;
}

Assistant:

static JSValue js_typed_array_join(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int toLocaleString)
{
    JSValue sep = JS_UNDEFINED, el;
    StringBuffer b_s, *b = &b_s;
    JSString *p = NULL;
    int i, n;
    int c;

    n = js_typed_array_get_length_internal(ctx, this_val);
    if (n < 0)
        goto exception;

    c = ',';    /* default separator */
    if (!toLocaleString && argc > 0 && !JS_IsUndefined(argv[0])) {
        sep = JS_ToString(ctx, argv[0]);
        if (JS_IsException(sep))
            goto exception;
        p = JS_VALUE_GET_STRING(sep);
        if (p->len == 1 && !p->is_wide_char)
            c = p->u.str8[0];
        else
            c = -1;
    }
    string_buffer_init(ctx, b, 0);

    /* XXX: optimize with direct access */
    for(i = 0; i < n; i++) {
        if (i > 0) {
            if (c >= 0) {
                if (string_buffer_putc8(b, c))
                    goto fail;
            } else {
                if (string_buffer_concat(b, p, 0, p->len))
                    goto fail;
            }
        }
        el = JS_GetPropertyUint32(ctx, this_val, i);
        /* Can return undefined for example if the typed array is detached */
        if (!JS_IsNull(el) && !JS_IsUndefined(el)) {
            if (JS_IsException(el))
                goto fail;
            if (toLocaleString) {
                el = JS_ToLocaleStringFree(ctx, el);
            }
            if (string_buffer_concat_value_free(b, el))
                goto fail;
        }
    }
    JS_FreeValue(ctx, sep);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
    JS_FreeValue(ctx, sep);
exception:
    return JS_EXCEPTION;
}